

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_pink.c
# Opt level: O0

int patestCallback(void *inputBuffer,void *outputBuffer,unsigned_long framesPerBuffer,
                  PaStreamCallbackTimeInfo *timeInfo,PaStreamCallbackFlags statusFlags,
                  void *userData)

{
  float *pfVar1;
  bool bVar2;
  float fVar3;
  float *local_58;
  float *out;
  paTestData *data;
  int local_40;
  int numFrames;
  int i;
  int finished;
  void *userData_local;
  PaStreamCallbackFlags statusFlags_local;
  PaStreamCallbackTimeInfo *timeInfo_local;
  unsigned_long framesPerBuffer_local;
  void *outputBuffer_local;
  void *inputBuffer_local;
  
  bVar2 = framesPerBuffer <= *(uint *)((long)userData + 0x210);
  if (bVar2) {
    data._4_4_ = (int)framesPerBuffer;
  }
  else {
    data._4_4_ = *(int *)((long)userData + 0x210);
  }
  numFrames = (int)!bVar2;
  local_58 = (float *)outputBuffer;
  for (local_40 = 0; local_40 < data._4_4_; local_40 = local_40 + 1) {
    fVar3 = GeneratePinkNoise((PinkNoise *)userData);
    pfVar1 = local_58 + 1;
    *local_58 = fVar3;
    fVar3 = GeneratePinkNoise((PinkNoise *)((long)userData + 0x108));
    local_58 = local_58 + 2;
    *pfVar1 = fVar3;
  }
  *(int *)((long)userData + 0x210) = *(int *)((long)userData + 0x210) - data._4_4_;
  return numFrames;
}

Assistant:

static int patestCallback(const void*                     inputBuffer,
                          void*                           outputBuffer,
                          unsigned long                   framesPerBuffer,
			              const PaStreamCallbackTimeInfo* timeInfo,
			              PaStreamCallbackFlags           statusFlags,
                          void*                           userData)
{
    int finished;
    int i;
    int numFrames;
    paTestData *data = (paTestData*)userData;
    float *out = (float*)outputBuffer;
    (void) inputBuffer; /* Prevent "unused variable" warnings. */

    /* Are we almost at end. */
    if( data->sampsToGo < framesPerBuffer )
    {
        numFrames = data->sampsToGo;
        finished = 1;
    }
    else
    {
        numFrames = framesPerBuffer;
        finished = 0;
    }
    for( i=0; i<numFrames; i++ )
    {
        *out++ = GeneratePinkNoise( &data->leftPink );
        *out++ = GeneratePinkNoise( &data->rightPink );
    }
    data->sampsToGo -= numFrames;
    return finished;
}